

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sigproc.cc
# Opt level: O1

float sptk::snack::wind_energy
                (float *data,int size,int w_type,int *nwindp,float **dwindp,int *n0p,float **dinp,
                int *wsizep,float **windp)

{
  int iVar1;
  float *dout;
  long lVar2;
  float fVar3;
  float fVar4;
  
  iVar1 = *nwindp;
  dout = *dwindp;
  if (iVar1 < size) {
    if (dout == (float *)0x0) {
      dout = (float *)malloc((long)size << 2);
    }
    else {
      dout = (float *)realloc(dout,(long)size << 2);
    }
    if (dout == (float *)0x0) {
      wind_energy();
      return 0.0;
    }
    *dwindp = dout;
  }
  if (iVar1 != size) {
    xget_window(dout,size,w_type,n0p,dinp,wsizep,windp);
    *nwindp = size;
  }
  fVar3 = 0.0;
  if (0 < size) {
    iVar1 = size + 1;
    lVar2 = 0;
    do {
      fVar4 = *(float *)((long)dout + lVar2) * *(float *)((long)data + lVar2);
      fVar3 = fVar3 + fVar4 * fVar4;
      iVar1 = iVar1 + -1;
      lVar2 = lVar2 + 4;
    } while (1 < iVar1);
  }
  fVar3 = fVar3 / (float)size;
  if (0.0 <= fVar3) {
    return SQRT(fVar3);
  }
  fVar3 = sqrtf(fVar3);
  return fVar3;
}

Assistant:

float wind_energy(float *data, int size, int w_type, int *nwindp,
                  float **dwindp, int *n0p, float **dinp, int *wsizep,
                  float **windp)
#endif
{
#if 0
  static int nwind = 0;
  static float *dwind = NULL;
#else
  int nwind = *nwindp;
  float *dwind = *dwindp;
#endif
  register float *dp, sum, f;
  register int i;

  if(nwind < size) {
    if(dwind) dwind = (float*)ckrealloc((void *)dwind,size*sizeof(float));
    else dwind = (float*)ckalloc(size*sizeof(float));
    if(!dwind) {
      Fprintf(stderr,"Can't allocate scratch memory in wind_energy()\n");
      return(0.0);
    }
#if 1
    *dwindp = dwind;
#endif
  }
  if(nwind != size) {
#if 0
    xget_window(dwind, size, w_type);
    nwind = size;
#else
    xget_window(dwind, size, w_type, n0p, dinp, wsizep, windp);
    *nwindp = size;
#endif
  }
  for(i=size, dp = dwind, sum = 0.0; i-- > 0; ) {
    f = *dp++ * (float)(*data++);
    sum += f*f;
  }
  return((float)sqrt((double)(sum/size)));
}